

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::JavaHprofConfig::ParseFromArray(JavaHprofConfig *this,void *raw,size_t size)

{
  pointer puVar1;
  uint64_t uVar2;
  undefined1 uVar3;
  uint uVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t *end;
  ulong uVar11;
  uint64_t int_value;
  uint64_t preamble;
  uint32_t local_78;
  ushort local_74;
  uint8_t local_72;
  uint64_t payload_length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  bitset<8UL> *local_40;
  uint64_t payload_length_1;
  
  local_48 = &this->process_cmdline_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_48);
  puVar1 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_50 = &this->pid_;
  local_58 = &this->target_installed_by_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_58);
  local_60 = &this->ignored_types_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_60);
  local_68 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar10 = 0;
  do {
    if (end <= raw) goto switchD_002bcf24_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar7 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar7 != (uint64_t *)raw) goto LAB_002bceeb;
LAB_002bd2cd:
      uVar10 = 0;
      uVar8 = 0;
      goto LAB_002bd029;
    }
    puVar7 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002bceeb:
    uVar2 = preamble;
    uVar11 = preamble >> 3;
    uVar4 = (uint)uVar11;
    if ((uVar4 == 0) || (end <= puVar7)) goto LAB_002bd2cd;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar6 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar7,(uint8_t *)end,&int_value);
      uVar9 = 0;
      uVar8 = 0;
      if (puVar6 == puVar7) goto LAB_002bd029;
      break;
    case 1:
      puVar6 = puVar7 + 1;
      if (end < puVar6) goto switchD_002bcf24_caseD_3;
      int_value = *puVar7;
LAB_002bcf70:
      uVar9 = 0;
      break;
    case 2:
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar7,(uint8_t *)end,&payload_length)
      ;
      if ((puVar5 == puVar7) || ((ulong)((long)end - (long)puVar5) < payload_length))
      goto switchD_002bcf24_caseD_3;
      puVar6 = (uint64_t *)((long)puVar5 + payload_length);
      uVar9 = payload_length;
      int_value = (uint64_t)puVar5;
      break;
    default:
      goto switchD_002bcf24_caseD_3;
    case 5:
      puVar6 = (uint64_t *)((long)puVar7 + 4);
      if (puVar6 <= end) {
        int_value = (uint64_t)(uint)*puVar7;
        goto LAB_002bcf70;
      }
      goto switchD_002bcf24_caseD_3;
    }
    raw = puVar6;
  } while ((0xffff < uVar4) || (0xfffffff < uVar9));
  uVar10 = uVar9 | (uVar2 & 7) << 0x30 | uVar11 << 0x20;
  uVar8 = int_value;
LAB_002bd029:
  local_40 = &this->_has_field_;
LAB_002bd03c:
  do {
    preamble = uVar8;
    local_78 = (uint32_t)uVar10;
    local_72 = (uint8_t)(uVar10 >> 0x30);
    uVar4 = (uint)(uVar10 >> 0x20);
    local_74 = (ushort)(uVar10 >> 0x20);
    if (local_74 == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_74 < 8) {
      std::bitset<8UL>::set(local_40,(ulong)(uVar4 & 7),true);
      uVar4 = (uint)local_74;
    }
    uVar4 = (uVar4 & 0xffff) - 1;
    if (uVar4 < 7) {
      uVar3 = (*(code *)(&DAT_00379c44 + *(int *)(&DAT_00379c44 + (ulong)uVar4 * 4)))();
      return (bool)uVar3;
    }
    protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
              ((Field *)&preamble,local_68);
    do {
      if (end <= raw) {
LAB_002bd2ac:
        uVar10 = 0;
        uVar8 = 0;
        goto LAB_002bd03c;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar7 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar7 == (uint64_t *)raw) goto LAB_002bd2ac;
      }
      else {
        puVar7 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar2 = int_value;
      uVar11 = int_value >> 3;
      uVar4 = (uint)uVar11;
      if ((uVar4 == 0) || (end <= puVar7)) goto LAB_002bd2ac;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar6 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar7,(uint8_t *)end,&payload_length);
        uVar9 = 0;
        uVar10 = 0;
        uVar8 = 0;
        if (puVar6 == puVar7) goto LAB_002bd03c;
        break;
      case 1:
        puVar6 = puVar7 + 1;
        if (end < puVar6) goto switchD_002bd1b5_caseD_3;
        payload_length = *puVar7;
LAB_002bd20b:
        uVar9 = 0;
        break;
      case 2:
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar7,(uint8_t *)end,&payload_length_1);
        if ((puVar5 == puVar7) || ((ulong)((long)end - (long)puVar5) < payload_length_1))
        goto switchD_002bd1b5_caseD_3;
        puVar6 = (uint64_t *)((long)puVar5 + payload_length_1);
        uVar9 = payload_length_1;
        payload_length = (uint64_t)puVar5;
        break;
      default:
        goto switchD_002bd1b5_caseD_3;
      case 5:
        puVar6 = (uint64_t *)((long)puVar7 + 4);
        if (puVar6 <= end) {
          payload_length = (uint64_t)(uint)*puVar7;
          goto LAB_002bd20b;
        }
        goto switchD_002bd1b5_caseD_3;
      }
      raw = puVar6;
    } while ((0xffff < uVar4) || (0xfffffff < uVar9));
    uVar10 = uVar9 | (uVar2 & 7) << 0x30 | uVar11 << 0x20;
    uVar8 = payload_length;
  } while( true );
switchD_002bcf24_caseD_3:
  uVar10 = 0;
  uVar8 = 0;
  goto LAB_002bd029;
switchD_002bd1b5_caseD_3:
  uVar10 = 0;
  uVar8 = 0;
  goto LAB_002bd03c;
}

Assistant:

bool JavaHprofConfig::ParseFromArray(const void* raw, size_t size) {
  process_cmdline_.clear();
  pid_.clear();
  target_installed_by_.clear();
  ignored_types_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* process_cmdline */:
        process_cmdline_.emplace_back();
        field.get(&process_cmdline_.back());
        break;
      case 2 /* pid */:
        pid_.emplace_back();
        field.get(&pid_.back());
        break;
      case 7 /* target_installed_by */:
        target_installed_by_.emplace_back();
        field.get(&target_installed_by_.back());
        break;
      case 3 /* continuous_dump_config */:
        (*continuous_dump_config_).ParseFromArray(field.data(), field.size());
        break;
      case 4 /* min_anonymous_memory_kb */:
        field.get(&min_anonymous_memory_kb_);
        break;
      case 5 /* dump_smaps */:
        field.get(&dump_smaps_);
        break;
      case 6 /* ignored_types */:
        ignored_types_.emplace_back();
        field.get(&ignored_types_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}